

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlSchemaTypePtr
xmlSchemaParseSimpleType
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node,int topLevel)

{
  xmlChar **uri;
  byte *pbVar1;
  xmlSchemaTypePtr pxVar2;
  xmlSchemaTypePtr annItem;
  int iVar3;
  xmlAttrPtr pxVar4;
  xmlSchemaTypePtr pxVar5;
  xmlChar *value;
  xmlSchemaAnnotPtr pxVar6;
  xmlSchemaTypePtr pxVar7;
  undefined4 in_register_0000000c;
  xmlNodePtr ownerElem;
  _xmlNode *node_00;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlSchemaBasicItemPtr pxVar8;
  xmlSchemaBasicItemPtr extraout_RDX_04;
  xmlChar **in_R8;
  char *in_R9;
  _xmlAttr *p_Var9;
  _xmlNode *node_01;
  bool bVar10;
  xmlChar *attrValue;
  undefined8 in_stack_ffffffffffffff98;
  xmlChar **local;
  uint uVar11;
  undefined8 in_stack_ffffffffffffffa0;
  xmlAttrPtr pxVar12;
  
  uVar11 = (uint)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  ownerElem = (xmlNodePtr)CONCAT44(in_register_0000000c,topLevel);
  pxVar12 = (xmlAttrPtr)0x0;
  if (node == (xmlNodePtr)0x0) {
    return (xmlSchemaTypePtr)0x0;
  }
  if (topLevel == 0) {
LAB_00198cce:
    local = (xmlChar **)((ulong)uVar11 << 0x20);
    pxVar12 = (xmlAttrPtr)0x0;
    pxVar5 = xmlSchemaAddType(ctxt,schema,XML_SCHEMA_TYPE_SIMPLE,(xmlChar *)0x0,
                              ctxt->targetNamespace,node,0);
    if (pxVar5 == (xmlSchemaTypePtr)0x0) {
      return (xmlSchemaTypePtr)0x0;
    }
    pxVar5->type = XML_SCHEMA_TYPE_SIMPLE;
    pxVar5->contentType = XML_SCHEMA_CONTENT_SIMPLE;
    for (p_Var9 = node->properties; p_Var9 != (_xmlAttr *)0x0; p_Var9 = p_Var9->next) {
      if (p_Var9->ns == (xmlNs *)0x0) {
        iVar3 = xmlStrEqual(p_Var9->name,"id");
        pxVar8 = extraout_RDX_02;
        if (iVar3 == 0) goto LAB_00198d44;
      }
      else {
        iVar3 = xmlStrEqual(p_Var9->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        pxVar8 = extraout_RDX_01;
        if (iVar3 != 0) {
LAB_00198d44:
          xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var9,pxVar8,pxVar12);
        }
      }
    }
  }
  else {
    pxVar4 = xmlSchemaGetPropNode(node,"name");
    if (pxVar4 == (xmlAttrPtr)0x0) {
      xmlSchemaPMissingAttrErr
                (ctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x1ce024,ownerElem,(char *)in_R8,
                 in_R9);
      return (xmlSchemaTypePtr)0x0;
    }
    pxVar5 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
    iVar3 = xmlSchemaPValAttrNode
                      (ctxt,(xmlSchemaBasicItemPtr)pxVar4,(xmlAttrPtr)pxVar5,
                       (xmlSchemaTypePtr)&stack0xffffffffffffffb0,in_R8);
    if (iVar3 != 0) {
      return (xmlSchemaTypePtr)0x0;
    }
    if (ctxt->isS4S != 0) {
      if (ctxt->isRedefine == 0) {
        pxVar5 = xmlSchemaGetPredefinedType
                           ((xmlChar *)pxVar12,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        bVar10 = pxVar5 == (xmlSchemaTypePtr)0x0;
      }
      else {
        uVar11 = 0;
        in_stack_ffffffffffffffa0 = 0;
        bVar10 = false;
        xmlSchemaPCustomErrExt
                  (ctxt,XML_SCHEMAP_SRC_REDEFINE,(xmlSchemaBasicItemPtr)0x0,node,
                   "Redefinition of built-in simple types is not supported",(xmlChar *)0x0,
                   (xmlChar *)0x0,(xmlChar *)0x0);
        pxVar5 = (xmlSchemaTypePtr)0x0;
      }
      if (!bVar10) {
        return pxVar5;
      }
    }
    if (topLevel == 0) goto LAB_00198cce;
    local = (xmlChar **)CONCAT44(uVar11,1);
    pxVar5 = xmlSchemaAddType(ctxt,schema,XML_SCHEMA_TYPE_SIMPLE,(xmlChar *)pxVar12,
                              ctxt->targetNamespace,node,1);
    iVar3 = (int)in_stack_ffffffffffffffa0;
    if (pxVar5 == (xmlSchemaTypePtr)0x0) {
      return (xmlSchemaTypePtr)0x0;
    }
    pxVar5->type = XML_SCHEMA_TYPE_SIMPLE;
    pxVar5->contentType = XML_SCHEMA_CONTENT_SIMPLE;
    *(byte *)&pxVar5->flags = (byte)pxVar5->flags | 8;
    for (p_Var9 = node->properties; p_Var9 != (_xmlAttr *)0x0; p_Var9 = p_Var9->next) {
      if (p_Var9->ns == (xmlNs *)0x0) {
        iVar3 = xmlStrEqual(p_Var9->name,"id");
        if (((iVar3 == 0) && (iVar3 = xmlStrEqual(p_Var9->name,"name"), iVar3 == 0)) &&
           (iVar3 = xmlStrEqual(p_Var9->name,(xmlChar *)"final"), pxVar8 = extraout_RDX_00,
           iVar3 == 0)) goto LAB_00198bed;
      }
      else {
        iVar3 = xmlStrEqual(p_Var9->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        pxVar8 = extraout_RDX;
        if (iVar3 != 0) {
LAB_00198bed:
          xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var9,pxVar8,pxVar12);
        }
      }
      iVar3 = (int)in_stack_ffffffffffffffa0;
    }
    pxVar4 = xmlSchemaGetPropNode(node,"final");
    if (pxVar4 == (xmlAttrPtr)0x0) {
      uVar11 = schema->flags;
      if ((uVar11 & 8) != 0) {
        pbVar1 = (byte *)((long)&pxVar5->flags + 1);
        *pbVar1 = *pbVar1 | 4;
      }
      if ((uVar11 & 0x10) != 0) {
        pbVar1 = (byte *)((long)&pxVar5->flags + 1);
        *pbVar1 = *pbVar1 | 8;
      }
      if ((uVar11 & 0x20) != 0) {
        pbVar1 = (byte *)((long)&pxVar5->flags + 1);
        *pbVar1 = *pbVar1 | 0x10;
      }
    }
    else {
      value = xmlSchemaGetProp(ctxt,node,"final");
      local = (xmlChar **)CONCAT44((int)((ulong)local >> 0x20),0x1000);
      pxVar12 = (xmlAttrPtr)0x400;
      iVar3 = xmlSchemaPValAttrBlockFinal(value,&pxVar5->flags,-1,0x400,-1,0x800,0x1000,iVar3);
      if (iVar3 != 0) {
        local = (xmlChar **)0x0;
        pxVar12 = (xmlAttrPtr)0x0;
        xmlSchemaPSimpleTypeErr
                  (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar4,
                   (xmlNodePtr)0x0,(xmlSchemaTypePtr)"(#all | List of (list | union | restriction)",
                   (char *)value,(xmlChar *)0x0,(char *)0x0,(xmlChar *)schema,value);
      }
    }
  }
  pxVar5->targetNamespace = ctxt->targetNamespace;
  pxVar4 = xmlSchemaGetPropNode(node,"id");
  if (pxVar4 != (xmlAttrPtr)0x0) {
    xmlSchemaPValAttrNodeID(ctxt,pxVar4);
  }
  pxVar2 = ctxt->ctxtType;
  ctxt->ctxtType = pxVar5;
  node_01 = node->children;
  if (node_01 == (xmlNodePtr)0x0) {
    node_01 = (xmlNodePtr)0x0;
  }
  else if (((node_01->ns != (xmlNs *)0x0) &&
           (iVar3 = xmlStrEqual(node_01->name,(xmlChar *)"annotation"), iVar3 != 0)) &&
          (iVar3 = xmlStrEqual(node_01->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
          iVar3 != 0)) {
    pxVar6 = xmlSchemaParseAnnotation(ctxt,node_01,1);
    pxVar5->annot = pxVar6;
    node_01 = node_01->next;
  }
  if (node_01 == (xmlNodePtr)0x0) {
    node_01 = (xmlNodePtr)0x0;
    xmlSchemaPContentErr
              (ctxt,XML_SCHEMAP_S4S_ELEM_MISSING,(xmlSchemaBasicItemPtr)node,(xmlNodePtr)0x0,
               (xmlNodePtr)0x0,"(annotation?, (restriction | list | union))",(char *)local);
  }
  else {
    if (((node_01->ns != (xmlNs *)0x0) &&
        (iVar3 = xmlStrEqual(node_01->name,(xmlChar *)"restriction"), iVar3 != 0)) &&
       (iVar3 = xmlStrEqual(node_01->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
       iVar3 != 0)) {
      xmlSchemaParseRestriction(ctxt,schema,node_01,XML_SCHEMA_TYPE_SIMPLE);
      node_01 = node_01->next;
      bVar10 = true;
      goto LAB_001991d7;
    }
    if (((node_01->ns == (xmlNs *)0x0) || (iVar3 = xmlStrEqual(node_01->name,"list"), iVar3 == 0))
       || (iVar3 = xmlStrEqual(node_01->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
          iVar3 == 0)) {
      if (((node_01->ns == (xmlNs *)0x0) || (iVar3 = xmlStrEqual(node_01->name,"union"), iVar3 == 0)
          ) || (iVar3 = xmlStrEqual(node_01->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar3 == 0)) goto LAB_001991d4;
      xmlSchemaParseUnion(ctxt,schema,node_01);
    }
    else {
      annItem = ctxt->ctxtType;
      annItem->flags = annItem->flags | 0x40;
      pxVar7 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYSIMPLETYPE);
      annItem->baseType = pxVar7;
      for (p_Var9 = node_01->properties; p_Var9 != (_xmlAttr *)0x0; p_Var9 = p_Var9->next) {
        if (p_Var9->ns == (xmlNs *)0x0) {
          iVar3 = xmlStrEqual(p_Var9->name,"id");
          if ((iVar3 == 0) &&
             (iVar3 = xmlStrEqual(p_Var9->name,(xmlChar *)"itemType"), pxVar8 = extraout_RDX_04,
             iVar3 == 0)) goto LAB_00198ef3;
        }
        else {
          iVar3 = xmlStrEqual(p_Var9->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
          pxVar8 = extraout_RDX_03;
          if (iVar3 != 0) {
LAB_00198ef3:
            xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var9,pxVar8,pxVar12);
          }
        }
      }
      pxVar12 = xmlSchemaGetPropNode(node_01,"id");
      if (pxVar12 != (xmlAttrPtr)0x0) {
        xmlSchemaPValAttrNodeID(ctxt,pxVar12);
      }
      uri = &annItem->base;
      xmlSchemaPValAttrQName
                (ctxt,schema,(xmlSchemaBasicItemPtr)node_01,(xmlNodePtr)"itemType",
                 (char *)&annItem->baseNs,uri,local);
      node_00 = node_01->children;
      if (node_00 == (xmlNodePtr)0x0) {
        node_00 = (xmlNodePtr)0x0;
      }
      else if (((node_00->ns != (xmlNs *)0x0) &&
               (iVar3 = xmlStrEqual(node_00->name,(xmlChar *)"annotation"), iVar3 != 0)) &&
              (iVar3 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
              iVar3 != 0)) {
        pxVar6 = xmlSchemaParseAnnotation(ctxt,node_00,1);
        xmlSchemaAddAnnotation((xmlSchemaAnnotItemPtr)annItem,pxVar6);
        node_00 = node_00->next;
      }
      if (((node_00 == (xmlNodePtr)0x0) || (node_00->ns == (xmlNs *)0x0)) ||
         ((iVar3 = xmlStrEqual(node_00->name,"simpleType"), iVar3 == 0 ||
          (iVar3 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
          iVar3 == 0)))) {
        if (*uri == (xmlChar *)0x0) {
          local = (xmlChar **)0x0;
          xmlSchemaPCustomErrExt
                    (ctxt,XML_SCHEMAP_SRC_SIMPLE_TYPE_1,(xmlSchemaBasicItemPtr)0x0,node_01,
                     "Either the attribute \'itemType\' or the <simpleType> child must be present",
                     (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
        }
      }
      else {
        if (*uri == (xmlChar *)0x0) {
          pxVar7 = xmlSchemaParseSimpleType(ctxt,schema,node_00,0);
          annItem->subtypes = pxVar7;
        }
        else {
          local = (xmlChar **)0x0;
          xmlSchemaPCustomErrExt
                    (ctxt,XML_SCHEMAP_SRC_SIMPLE_TYPE_1,(xmlSchemaBasicItemPtr)0x0,node_01,
                     "The attribute \'itemType\' and the <simpleType> child are mutually exclusive",
                     (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
        }
        node_00 = node_00->next;
      }
      if (node_00 != (xmlNodePtr)0x0) {
        xmlSchemaPContentErr
                  (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node_01,node_00,
                   (xmlNodePtr)0x0,"(annotation?, simpleType?)",(char *)local);
      }
      if (((*uri == (xmlChar *)0x0) && (annItem->subtypes == (xmlSchemaTypePtr)0x0)) &&
         (pxVar12 = xmlSchemaGetPropNode(node_01,"itemType"), pxVar12 == (xmlAttrPtr)0x0)) {
        local = (xmlChar **)0x0;
        xmlSchemaPCustomErrExt
                  (ctxt,XML_SCHEMAP_SRC_SIMPLE_TYPE_1,(xmlSchemaBasicItemPtr)0x0,node_01,
                   "Either the attribute \'itemType\' or the <simpleType> child must be present",
                   (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
      }
    }
    node_01 = node_01->next;
  }
LAB_001991d4:
  bVar10 = false;
LAB_001991d7:
  if (node_01 != (xmlNodePtr)0x0) {
    xmlSchemaPContentErr
              (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,node_01,
               (xmlNodePtr)0x0,"(annotation?, (restriction | list | union))",(char *)local);
  }
  if ((topLevel != 0) && (!bVar10 && ctxt->isRedefine != 0)) {
    xmlSchemaPCustomErrExt
              (ctxt,XML_SCHEMAP_SRC_REDEFINE,(xmlSchemaBasicItemPtr)0x0,node,
               "This is a redefinition, thus the <simpleType> must have a <restriction> child",
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
  }
  ctxt->ctxtType = pxVar2;
  return pxVar5;
}

Assistant:

static xmlSchemaTypePtr
xmlSchemaParseSimpleType(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                         xmlNodePtr node, int topLevel)
{
    xmlSchemaTypePtr type, oldCtxtType;
    xmlNodePtr child = NULL;
    const xmlChar *attrValue = NULL;
    xmlAttrPtr attr;
    int hasRestriction = 0;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    if (topLevel) {
	attr = xmlSchemaGetPropNode(node, "name");
	if (attr == NULL) {
	    xmlSchemaPMissingAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_MISSING,
		NULL, node,
		"name", NULL);
	    return (NULL);
	} else {
	    if (xmlSchemaPValAttrNode(ctxt,
		NULL, attr,
		xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME), &attrValue) != 0)
		return (NULL);
	    /*
	    * Skip built-in types.
	    */
	    if (ctxt->isS4S) {
		xmlSchemaTypePtr biType;

		if (ctxt->isRedefine) {
		    /*
		    * REDEFINE: Disallow redefinition of built-in-types.
		    * TODO: It seems that the spec does not say anything
		    * about this case.
		    */
		    xmlSchemaPCustomErr(ctxt, XML_SCHEMAP_SRC_REDEFINE,
			NULL, node,
			"Redefinition of built-in simple types is not "
			"supported", NULL);
		    return(NULL);
		}
		biType = xmlSchemaGetPredefinedType(attrValue, xmlSchemaNs);
		if (biType != NULL)
		    return (biType);
	    }
	}
    }
    /*
    * TargetNamespace:
    * SPEC "The `actual value` of the targetNamespace [attribute]
    * of the <schema> ancestor element information item if present,
    * otherwise `absent`.
    */
    if (topLevel == 0) {
#ifdef ENABLE_NAMED_LOCALS
        char buf[40];
#endif
	/*
	* Parse as local simple type definition.
	*/
#ifdef ENABLE_NAMED_LOCALS
        snprintf(buf, 39, "#ST%d", ctxt->counter++ + 1);
	type = xmlSchemaAddType(ctxt, schema,
	    XML_SCHEMA_TYPE_SIMPLE,
	    xmlDictLookup(ctxt->dict, (const xmlChar *)buf, -1),
	    ctxt->targetNamespace, node, 0);
#else
	type = xmlSchemaAddType(ctxt, schema,
	    XML_SCHEMA_TYPE_SIMPLE,
	    NULL, ctxt->targetNamespace, node, 0);
#endif
	if (type == NULL)
	    return (NULL);
	type->type = XML_SCHEMA_TYPE_SIMPLE;
	type->contentType = XML_SCHEMA_CONTENT_SIMPLE;
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if (!xmlStrEqual(attr->name, BAD_CAST "id")) {
		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
    } else {
	/*
	* Parse as global simple type definition.
	*
	* Note that attrValue is the value of the attribute "name" here.
	*/
	type = xmlSchemaAddType(ctxt, schema, XML_SCHEMA_TYPE_SIMPLE,
	    attrValue, ctxt->targetNamespace, node, 1);
	if (type == NULL)
	    return (NULL);
	type->type = XML_SCHEMA_TYPE_SIMPLE;
	type->contentType = XML_SCHEMA_CONTENT_SIMPLE;
	type->flags |= XML_SCHEMAS_TYPE_GLOBAL;
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if ((!xmlStrEqual(attr->name, BAD_CAST "id")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "name")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "final"))) {
		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
	/*
	* Attribute "final".
	*/
	attr = xmlSchemaGetPropNode(node, "final");
	if (attr == NULL) {
	    if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_RESTRICTION)
		type->flags |= XML_SCHEMAS_TYPE_FINAL_RESTRICTION;
	    if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_LIST)
		type->flags |= XML_SCHEMAS_TYPE_FINAL_LIST;
	    if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_UNION)
		type->flags |= XML_SCHEMAS_TYPE_FINAL_UNION;
	} else {
	    attrValue = xmlSchemaGetProp(ctxt, node, "final");
	    if (xmlSchemaPValAttrBlockFinal(attrValue, &(type->flags),
		-1, -1, XML_SCHEMAS_TYPE_FINAL_RESTRICTION, -1,
		XML_SCHEMAS_TYPE_FINAL_LIST,
		XML_SCHEMAS_TYPE_FINAL_UNION) != 0) {

		xmlSchemaPSimpleTypeErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
		    WXS_BASIC_CAST type, (xmlNodePtr) attr,
		    NULL, "(#all | List of (list | union | restriction)",
		    attrValue, NULL, NULL, NULL);
	    }
	}
    }
    type->targetNamespace = ctxt->targetNamespace;
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    /*
    * And now for the children...
    */
    oldCtxtType = ctxt->ctxtType;

    ctxt->ctxtType = type;

    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
        type->annot = xmlSchemaParseAnnotation(ctxt, child, 1);
        child = child->next;
    }
    if (child == NULL) {
	xmlSchemaPContentErr(ctxt, XML_SCHEMAP_S4S_ELEM_MISSING,
	    NULL, node, child, NULL,
	    "(annotation?, (restriction | list | union))");
    } else if (IS_SCHEMA(child, "restriction")) {
        xmlSchemaParseRestriction(ctxt, schema, child,
	    XML_SCHEMA_TYPE_SIMPLE);
	hasRestriction = 1;
        child = child->next;
    } else if (IS_SCHEMA(child, "list")) {
        xmlSchemaParseList(ctxt, schema, child);
        child = child->next;
    } else if (IS_SCHEMA(child, "union")) {
        xmlSchemaParseUnion(ctxt, schema, child);
        child = child->next;
    }
    if (child != NULL) {
	xmlSchemaPContentErr(ctxt, XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child, NULL,
	    "(annotation?, (restriction | list | union))");
    }
    /*
    * REDEFINE: SPEC src-redefine (5)
    * "Within the [children], each <simpleType> must have a
    * <restriction> among its [children] ... the `actual value` of whose
    * base [attribute] must be the same as the `actual value` of its own
    * name attribute plus target namespace;"
    */
    if (topLevel && ctxt->isRedefine && (! hasRestriction)) {
	xmlSchemaPCustomErr(ctxt, XML_SCHEMAP_SRC_REDEFINE,
	    NULL, node, "This is a redefinition, thus the "
	    "<simpleType> must have a <restriction> child", NULL);
    }

    ctxt->ctxtType = oldCtxtType;
    return (type);
}